

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pusher.cpp
# Opt level: O3

void __thiscall DPusher::ChangeValues(DPusher *this,int magnitude,int angle)

{
  double __x;
  double dVar1;
  double dVar2;
  
  dVar2 = (double)magnitude;
  __x = FFastTrig::cos(&fasttrig,(double)angle * 1.40625 * 11930464.711111112 + 6755399441055744.0);
  dVar1 = FFastTrig::sin(&fasttrig,__x);
  (this->m_PushVec).X = dVar2 * __x;
  (this->m_PushVec).Y = dVar2 * dVar1;
  this->m_Magnitude = dVar2;
  return;
}

Assistant:

void ChangeValues (int magnitude, int angle)
	{
		DAngle ang = angle * (360. / 256.);
		m_PushVec = ang.ToVector(magnitude);
		m_Magnitude = magnitude;
	}